

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cDrawIndirectTests.cpp
# Opt level: O0

void __thiscall
glcts::anon_unknown_0::DrawIndirectBase::
ReadPixelsFloat<glcts::(anonymous_namespace)::test_api::ES3>
          (DrawIndirectBase *this,int x,int y,int width,int height,void *data)

{
  reference pixels;
  size_type sVar1;
  byte *pbVar2;
  ulong local_68;
  size_t i;
  allocator<unsigned_char> local_49;
  undefined1 local_48 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> uData;
  GLfloat *fData;
  void *data_local;
  int height_local;
  int width_local;
  int y_local;
  int x_local;
  DrawIndirectBase *this_local;
  
  uData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)data;
  std::allocator<unsigned_char>::allocator(&local_49);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_48,
             (long)(width * height * 4),&local_49);
  std::allocator<unsigned_char>::~allocator(&local_49);
  pixels = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_48,0);
  glu::CallLogWrapper::glReadPixels
            (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,x,y,width,height,0x1908
             ,0x1401,pixels);
  local_68 = 0;
  while( true ) {
    sVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_48);
    if (sVar1 <= local_68) break;
    pbVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_48,local_68);
    *(float *)(uData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage + local_68 * 4) = (float)*pbVar2 / 255.0;
    local_68 = local_68 + 1;
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_48);
  return;
}

Assistant:

void DrawIndirectBase::ReadPixelsFloat<test_api::ES3>(int x, int y, int width, int height, void* data)
{
	GLfloat*			 fData = reinterpret_cast<GLfloat*>(data);
	std::vector<GLubyte> uData(width * height * 4);
	glReadPixels(x, y, width, height, GL_RGBA, GL_UNSIGNED_BYTE, &uData[0]);
	for (size_t i = 0; i < uData.size(); i++)
	{
		fData[i] = float(uData[i]) / 255.0f;
	}
}